

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::Call(SQVM *this,SQObjectPtr *closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr *outres
          ,SQBool raiseerror)

{
  bool *suspend;
  SQObjectType SVar1;
  SQObjectPtr *this_00;
  SQObjectType ctype;
  undefined1 local_68 [8];
  SQObjectPtr temp;
  SQObjectPtr constr;
  bool dummy;
  SQBool raiseerror_local;
  SQObjectPtr *outres_local;
  SQInteger stackbase_local;
  SQInteger nparams_local;
  SQObjectPtr *closure_local;
  SQVM *this_local;
  
  SVar1 = (closure->super_SQObject)._type;
  if (SVar1 == OT_CLOSURE) {
    this_local._7_1_ = Execute(this,closure,nparams,stackbase,outres,raiseerror,ET_CALL);
  }
  else if (SVar1 == OT_NATIVECLOSURE) {
    suspend = (bool *)((long)&constr.super_SQObject._unVal + 7);
    this_local._7_1_ =
         CallNative(this,(closure->super_SQObject)._unVal.pNativeClosure,nparams,stackbase,outres,-1
                    ,suspend,suspend);
  }
  else if (SVar1 == OT_CLASS) {
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&temp.super_SQObject._unVal);
    ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_68);
    CreateClassInstance(this,(closure->super_SQObject)._unVal.pClass,outres,
                        (SQObjectPtr *)&temp.super_SQObject._unVal);
    if ((temp.super_SQObject._unVal.fFloat == 3.852095e-34) ||
       (temp.super_SQObject._unVal.fFloat == 3.8519774e-34)) {
      this_00 = sqvector<SQObjectPtr>::operator[](&this->_stack,stackbase);
      ::SQObjectPtr::operator=(this_00,outres);
      this_local._7_1_ =
           Call(this,(SQObjectPtr *)&temp.super_SQObject._unVal,nparams,stackbase,
                (SQObjectPtr *)local_68,raiseerror);
    }
    else {
      this_local._7_1_ = true;
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_68);
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&temp.super_SQObject._unVal);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQVM::Call(SQObjectPtr &closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr &outres,SQBool raiseerror)
{
#ifdef _DEBUG
SQInteger prevstackbase = _stackbase;
#endif
    switch(sq_type(closure)) {
    case OT_CLOSURE:
        return Execute(closure, nparams, stackbase, outres, raiseerror);
        break;
    case OT_NATIVECLOSURE:{
        bool dummy;
        return CallNative(_nativeclosure(closure), nparams, stackbase, outres, -1, dummy, dummy);

                          }
        break;
    case OT_CLASS: {
        SQObjectPtr constr;
        SQObjectPtr temp;
        CreateClassInstance(_class(closure),outres,constr);
        SQObjectType ctype = sq_type(constr);
        if (ctype == OT_NATIVECLOSURE || ctype == OT_CLOSURE) {
            _stack[stackbase] = outres;
            return Call(constr,nparams,stackbase,temp,raiseerror);
        }
        return true;
                   }
        break;
    default:
        return false;
    }
#ifdef _DEBUG
    if(!_suspended) {
        assert(_stackbase == prevstackbase);
    }
#endif
    return true;
}